

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

NSVGimage * nsvgParse(char *input,char *units,float dpi)

{
  char cVar1;
  float *pfVar2;
  NSVGgradient *pNVar3;
  NSVGgradientData *pNVar4;
  NSVGgradientData *__ptr;
  uint uVar5;
  int iVar6;
  NSVGparser *p;
  NSVGimage *pNVar7;
  NSVGshape *pNVar8;
  NSVGpath *pNVar9;
  long lVar10;
  NSVGshape *pNVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  p = (NSVGparser *)malloc(0x9c60);
  if (p == (NSVGparser *)0x0) {
LAB_0015939a:
    p = (NSVGparser *)0x0;
  }
  else {
    memset(p,0,0x9c60);
    pNVar7 = (NSVGimage *)malloc(0x10);
    p->image = pNVar7;
    if (pNVar7 == (NSVGimage *)0x0) {
      free(p);
      goto LAB_0015939a;
    }
    pNVar7->width = 0.0;
    pNVar7->height = 0.0;
    pNVar7->shapes = (NSVGshape *)0x0;
    p->attr[0].xform[0] = 1.0;
    p->attr[0].xform[1] = 0.0;
    p->attr[0].xform[2] = 0.0;
    p->attr[0].xform[3] = 1.0;
    p->attr[0].id[0] = '\0';
    p->attr[0].id[1] = '\0';
    p->attr[0].id[2] = '\0';
    p->attr[0].id[3] = '\0';
    p->attr[0].id[4] = '\0';
    p->attr[0].id[5] = '\0';
    p->attr[0].id[6] = '\0';
    p->attr[0].id[7] = '\0';
    p->attr[0].id[8] = '\0';
    p->attr[0].id[9] = '\0';
    p->attr[0].id[10] = '\0';
    p->attr[0].id[0xb] = '\0';
    p->attr[0].id[0xc] = '\0';
    p->attr[0].id[0xd] = '\0';
    p->attr[0].id[0xe] = '\0';
    p->attr[0].id[0xf] = '\0';
    p->attr[0].id[0x10] = '\0';
    p->attr[0].id[0x11] = '\0';
    p->attr[0].id[0x12] = '\0';
    p->attr[0].id[0x13] = '\0';
    p->attr[0].id[0x14] = '\0';
    p->attr[0].id[0x15] = '\0';
    p->attr[0].id[0x16] = '\0';
    p->attr[0].id[0x17] = '\0';
    p->attr[0].id[0x18] = '\0';
    p->attr[0].id[0x19] = '\0';
    p->attr[0].id[0x1a] = '\0';
    p->attr[0].id[0x1b] = '\0';
    p->attr[0].id[0x1c] = '\0';
    p->attr[0].id[0x1d] = '\0';
    p->attr[0].id[0x1e] = '\0';
    p->attr[0].id[0x1f] = '\0';
    p->attr[0].id[0x20] = '\0';
    p->attr[0].id[0x21] = '\0';
    p->attr[0].id[0x22] = '\0';
    p->attr[0].id[0x23] = '\0';
    p->attr[0].id[0x24] = '\0';
    p->attr[0].id[0x25] = '\0';
    p->attr[0].id[0x26] = '\0';
    p->attr[0].id[0x27] = '\0';
    p->attr[0].id[0x28] = '\0';
    p->attr[0].id[0x29] = '\0';
    p->attr[0].id[0x2a] = '\0';
    p->attr[0].id[0x2b] = '\0';
    p->attr[0].id[0x2c] = '\0';
    p->attr[0].id[0x2d] = '\0';
    p->attr[0].id[0x2e] = '\0';
    p->attr[0].id[0x2f] = '\0';
    p->attr[0].id[0x30] = '\0';
    p->attr[0].id[0x31] = '\0';
    p->attr[0].id[0x32] = '\0';
    p->attr[0].id[0x33] = '\0';
    p->attr[0].id[0x34] = '\0';
    p->attr[0].id[0x35] = '\0';
    p->attr[0].id[0x36] = '\0';
    p->attr[0].id[0x37] = '\0';
    p->attr[0].id[0x38] = '\0';
    p->attr[0].id[0x39] = '\0';
    p->attr[0].id[0x3a] = '\0';
    p->attr[0].id[0x3b] = '\0';
    p->attr[0].id[0x3c] = '\0';
    p->attr[0].id[0x3d] = '\0';
    p->attr[0].id[0x3e] = '\0';
    p->attr[0].id[0x3f] = '\0';
    p->attr[0].xform[4] = 0.0;
    p->attr[0].xform[5] = 0.0;
    p->attr[0].fillColor = 0;
    p->attr[0].strokeColor = 0;
    p->attr[0].opacity = 1.0;
    p->attr[0].fillOpacity = 1.0;
    p->attr[0].strokeOpacity = 1.0;
    p->attr[0].stopOpacity = 1.0;
    p->attr[0].strokeWidth = 1.0;
    p->attr[0].strokeLineJoin = '\0';
    p->attr[0].strokeLineCap = '\0';
    p->attr[0].miterLimit = 4.0;
    p->attr[0].fillRule = '\0';
    p->attr[0].hasFill = '\x01';
    p->attr[0].visible = '\x01';
  }
  if (p == (NSVGparser *)0x0) {
    return (NSVGimage *)0x0;
  }
  p->dpi = dpi;
  nsvg__parseXML(input,nsvg__startElement,nsvg__endElement,nsvg__content,p);
  pNVar7 = p->image;
  pNVar11 = pNVar7->shapes;
  fVar15 = 0.0;
  fVar12 = 0.0;
  fVar16 = 0.0;
  fVar14 = 0.0;
  if (pNVar11 != (NSVGshape *)0x0) {
    fVar15 = pNVar11->bounds[0];
    fVar12 = pNVar11->bounds[1];
    fVar16 = pNVar11->bounds[2];
    fVar14 = pNVar11->bounds[3];
    for (pNVar8 = pNVar11->next; pNVar8 != (NSVGshape *)0x0; pNVar8 = pNVar8->next) {
      if (pNVar8->bounds[0] <= fVar15) {
        fVar15 = pNVar8->bounds[0];
      }
      if (pNVar8->bounds[1] <= fVar12) {
        fVar12 = pNVar8->bounds[1];
      }
      if (fVar16 <= pNVar8->bounds[2]) {
        fVar16 = pNVar8->bounds[2];
      }
      if (fVar14 <= pNVar8->bounds[3]) {
        fVar14 = pNVar8->bounds[3];
      }
    }
  }
  if ((p->viewWidth == 0.0) && (!NAN(p->viewWidth))) {
    fVar17 = pNVar7->width;
    if (fVar17 <= 0.0) {
      p->viewMinx = fVar15;
      fVar17 = fVar16 - fVar15;
    }
    p->viewWidth = fVar17;
  }
  if ((p->viewHeight == 0.0) && (!NAN(p->viewHeight))) {
    fVar15 = pNVar7->height;
    if (fVar15 <= 0.0) {
      p->viewMiny = fVar12;
      fVar15 = fVar14 - fVar12;
    }
    p->viewHeight = fVar15;
  }
  if ((pNVar7->width == 0.0) && (!NAN(pNVar7->width))) {
    pNVar7->width = p->viewWidth;
  }
  fVar15 = 0.0;
  if ((pNVar7->height == 0.0) && (!NAN(pNVar7->height))) {
    pNVar7->height = p->viewHeight;
  }
  fVar12 = p->viewWidth;
  if (0.0 < fVar12) {
    fVar15 = pNVar7->width / fVar12;
  }
  fVar16 = p->viewHeight;
  fVar14 = 0.0;
  if (0.0 < fVar16) {
    fVar14 = pNVar7->height / fVar16;
  }
  fVar17 = p->viewMinx;
  fVar19 = p->viewMiny;
  uVar5 = nsvg__parseUnits(units);
  fVar13 = nsvg__convertToPixels(p,(NSVGcoordinate)(((ulong)uVar5 << 0x20) + 0x3f800000),0.0,1.0);
  if (p->alignType == 2) {
    if (fVar15 <= fVar14) {
      fVar15 = fVar14;
    }
    fVar18 = 0.0;
    if ((p->alignX != 0) && (fVar18 = pNVar7->width - fVar12 * fVar15, p->alignX != 2)) {
      fVar18 = fVar18 * 0.5;
    }
    fVar18 = fVar18 / fVar15;
    iVar6 = p->alignY;
    if (iVar6 == 0) {
      fVar14 = 0.0;
    }
    else {
LAB_0015964a:
      fVar14 = pNVar7->height - fVar16 * fVar15;
      if (iVar6 != 2) {
        fVar14 = fVar14 * 0.5;
      }
    }
  }
  else {
    if (p->alignType != 1) {
      fVar18 = -fVar17;
      fVar19 = -fVar19;
      goto LAB_0015969f;
    }
    if (fVar14 <= fVar15) {
      fVar15 = fVar14;
    }
    fVar14 = 0.0;
    fVar18 = 0.0;
    if ((p->alignX != 0) && (fVar18 = pNVar7->width - fVar12 * fVar15, p->alignX != 2)) {
      fVar18 = fVar18 * 0.5;
    }
    fVar18 = fVar18 / fVar15;
    iVar6 = p->alignY;
    if (iVar6 != 0) goto LAB_0015964a;
  }
  fVar18 = fVar18 - fVar17;
  fVar19 = fVar14 / fVar15 - fVar19;
  fVar14 = fVar15;
LAB_0015969f:
  if (pNVar11 != (NSVGshape *)0x0) {
    fVar15 = fVar15 * (1.0 / fVar13);
    fVar14 = (1.0 / fVar13) * fVar14;
    fVar12 = (fVar15 + fVar14) * 0.5;
    do {
      pNVar11->bounds[0] = (pNVar11->bounds[0] + fVar18) * fVar15;
      pNVar11->bounds[1] = (pNVar11->bounds[1] + fVar19) * fVar14;
      pNVar11->bounds[2] = (pNVar11->bounds[2] + fVar18) * fVar15;
      pNVar11->bounds[3] = (pNVar11->bounds[3] + fVar19) * fVar14;
      for (pNVar9 = pNVar11->paths; pNVar9 != (NSVGpath *)0x0; pNVar9 = pNVar9->next) {
        pNVar9->bounds[0] = (pNVar9->bounds[0] + fVar18) * fVar15;
        pNVar9->bounds[1] = (pNVar9->bounds[1] + fVar19) * fVar14;
        pNVar9->bounds[2] = (pNVar9->bounds[2] + fVar18) * fVar15;
        pNVar9->bounds[3] = (pNVar9->bounds[3] + fVar19) * fVar14;
        iVar6 = pNVar9->npts;
        if (0 < (long)iVar6) {
          pfVar2 = pNVar9->pts;
          lVar10 = 0;
          do {
            pfVar2[lVar10 * 2] = (pfVar2[lVar10 * 2] + fVar18) * fVar15;
            pfVar2[lVar10 * 2 + 1] = (pfVar2[lVar10 * 2 + 1] + fVar19) * fVar14;
            lVar10 = lVar10 + 1;
          } while (iVar6 != lVar10);
        }
      }
      if (((pNVar11->fill).type & 0xfeU) == 2) {
        nsvg__scaleGradient((pNVar11->fill).field_1.gradient,fVar18,fVar19,fVar15,fVar14);
        pNVar3 = (pNVar11->fill).field_1.gradient;
        local_28 = *(undefined8 *)(pNVar3->xform + 4);
        local_38 = *(undefined8 *)pNVar3->xform;
        uStack_30 = *(undefined8 *)(pNVar3->xform + 2);
        nsvg__xformInverse(pNVar3->xform,(float *)&local_38);
      }
      if (((pNVar11->stroke).type & 0xfeU) == 2) {
        nsvg__scaleGradient((pNVar11->stroke).field_1.gradient,fVar18,fVar19,fVar15,fVar14);
        pNVar3 = (pNVar11->stroke).field_1.gradient;
        local_28 = *(undefined8 *)(pNVar3->xform + 4);
        local_38 = *(undefined8 *)pNVar3->xform;
        uStack_30 = *(undefined8 *)(pNVar3->xform + 2);
        nsvg__xformInverse(pNVar3->xform,(float *)&local_38);
      }
      pNVar11->strokeWidth = pNVar11->strokeWidth * fVar12;
      pNVar11->strokeDashOffset = pNVar11->strokeDashOffset * fVar12;
      cVar1 = pNVar11->strokeDashCount;
      if (0 < (long)cVar1) {
        lVar10 = 0;
        do {
          pNVar11->strokeDashArray[lVar10] = pNVar11->strokeDashArray[lVar10] * fVar12;
          lVar10 = lVar10 + 1;
        } while (cVar1 != lVar10);
      }
      pNVar11 = pNVar11->next;
    } while (pNVar11 != (NSVGshape *)0x0);
  }
  pNVar7 = p->image;
  p->image = (NSVGimage *)0x0;
  nsvg__deletePaths(p->plist);
  __ptr = p->gradients;
  while (__ptr != (NSVGgradientData *)0x0) {
    pNVar4 = __ptr->next;
    free(__ptr->stops);
    free(__ptr);
    __ptr = pNVar4;
  }
  nsvgDelete(p->image);
  free(p->pts);
  free(p);
  return pNVar7;
}

Assistant:

NSVGimage* nsvgParse(char* input, const char* units, float dpi)
{
	NSVGparser* p;
	NSVGimage* ret = 0;

	p = nsvg__createParser();
	if (p == NULL) {
		return NULL;
	}
	p->dpi = dpi;

	nsvg__parseXML(input, nsvg__startElement, nsvg__endElement, nsvg__content, p);

	// Scale to viewBox
	nsvg__scaleToViewbox(p, units);

	ret = p->image;
	p->image = NULL;

	nsvg__deleteParser(p);

	return ret;
}